

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void uECC_decompress(uint8_t *compressed,uint8_t *public_key,uECC_Curve curve)

{
  uECC_word_t *puVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uECC_word_t point [8];
  uECC_word_t auStack_68 [8];
  
  puVar1 = auStack_68 + curve->num_words;
  uECC_vli_bytesToNative(auStack_68,compressed + 1,(int)curve->num_bytes);
  (*curve->x_side)(puVar1,auStack_68,curve);
  (*curve->mod_sqrt)(puVar1,curve);
  if ((((uint)*puVar1 & 1) != (*compressed & 1)) && (cVar2 = curve->num_words, 0 < (long)cVar2)) {
    lVar4 = 0;
    uVar6 = 0;
    do {
      uVar7 = puVar1[lVar4] + uVar6;
      if (uVar7 != 0) {
        uVar6 = (ulong)(curve->p[lVar4] < uVar7);
      }
      puVar1[lVar4] = curve->p[lVar4] - uVar7;
      lVar4 = lVar4 + 1;
    } while (cVar2 != lVar4);
  }
  uVar3 = (uint)curve->num_bytes;
  if ('\0' < curve->num_bytes) {
    lVar4 = (long)(int)uVar3;
    iVar5 = uVar3 * 8;
    lVar8 = 0;
    do {
      iVar5 = iVar5 + -8;
      uVar3 = uVar3 - 1;
      public_key[lVar8] =
           (uint8_t)(*(ulong *)((long)auStack_68 + (ulong)(uVar3 & 0xfffffff8)) >>
                    ((byte)iVar5 & 0x38));
      lVar8 = lVar8 + 1;
    } while (lVar4 != lVar8);
    cVar2 = curve->num_bytes;
    if (0 < (long)cVar2) {
      uVar3 = (uint)cVar2;
      lVar4 = (long)(int)uVar3;
      iVar5 = uVar3 * 8;
      lVar8 = 0;
      do {
        uVar3 = uVar3 - 1;
        iVar5 = iVar5 + -8;
        public_key[lVar8 + cVar2] =
             (uint8_t)(*(ulong *)((long)puVar1 + (ulong)(uVar3 & 0xfffffff8)) >>
                      ((byte)iVar5 & 0x38));
        lVar8 = lVar8 + 1;
      } while (lVar4 != lVar8);
    }
  }
  return;
}

Assistant:

void uECC_decompress(const uint8_t *compressed, uint8_t *public_key, uECC_Curve curve) {
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *point = (uECC_word_t *)public_key;
#else
    uECC_word_t point[uECC_MAX_WORDS * 2];
#endif
    uECC_word_t *y = point + curve->num_words;
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy(public_key, compressed+1, curve->num_bytes);
#else
    uECC_vli_bytesToNative(point, compressed + 1, curve->num_bytes);
#endif
    curve->x_side(y, point, curve);
    curve->mod_sqrt(y, curve);

    if ((y[0] & 0x01) != (compressed[0] & 0x01)) {
        uECC_vli_sub(y, curve->p, y, curve->num_words);
    }

#if uECC_VLI_NATIVE_LITTLE_ENDIAN == 0
    uECC_vli_nativeToBytes(public_key, curve->num_bytes, point);
    uECC_vli_nativeToBytes(public_key + curve->num_bytes, curve->num_bytes, y);
#endif
}